

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QWidgetTextControl::timerEvent(QWidgetTextControl *this,QTimerEvent *e)

{
  QWidgetTextControlPrivate *this_00;
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  if (*(TimerId *)(e + 0x10) == (this_00->cursorBlinkTimer).m_id) {
    this_00->cursorOn = (bool)(this_00->cursorOn ^ 1);
    cVar1 = QTextCursor::hasSelection();
    if (cVar1 != '\0') {
      pQVar3 = QApplication::style();
      iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x1c,0,0,0);
      this_00->cursorOn = (bool)(this_00->cursorOn & iVar2 != 0);
    }
    QWidgetTextControlPrivate::repaintCursor(this_00);
    return;
  }
  if (*(TimerId *)(e + 0x10) == (this_00->trippleClickTimer).m_id) {
    QBasicTimer::stop();
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }